

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O3

int __thiscall Arcflow::init(Arcflow *this,EVP_PKEY_CTX *ctx)

{
  NodeSet *this_00;
  Instance *this_01;
  int *piVar1;
  undefined4 uVar2;
  int iVar3;
  pointer piVar4;
  pointer pvVar5;
  iterator iVar6;
  pointer pAVar7;
  pointer pAVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pIVar12;
  int extraout_EAX;
  pointer pIVar13;
  clock_t cVar14;
  runtime_error *prVar15;
  pointer pIVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  pointer pvVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  vector<int,_std::allocator<int>_> *pvVar25;
  long lVar26;
  uint uVar27;
  vector<int,_std::allocator<int>_> max_state;
  char _error_msg_ [256];
  allocator_type local_169;
  vector<Item,_std::allocator<Item>_> local_168;
  vector<int,_std::allocator<int>_> *local_150;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_148;
  value_type local_13c;
  vector<Item,_std::allocator<Item>_> local_138 [11];
  
  if (this->ready != false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1f);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,(char *)local_138);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = &this->inst;
  (this->inst).n = *(int *)(ctx + 0x10);
  uVar10 = *(undefined8 *)ctx;
  uVar11 = *(undefined8 *)(ctx + 8);
  (this->inst).ndims = (int)uVar10;
  (this->inst).nbtypes = (int)((ulong)uVar10 >> 0x20);
  (this->inst).nsizes = (int)uVar11;
  (this->inst).m = (int)((ulong)uVar11 >> 0x20);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator=(&(this->inst).Ws,
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)(ctx + 0x18));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).Cs,(vector<int,_std::allocator<int>_> *)(ctx + 0x30));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).Qs,(vector<int,_std::allocator<int>_> *)(ctx + 0x48));
  std::vector<Item,_std::allocator<Item>_>::operator=
            (&(this->inst).items,(vector<Item,_std::allocator<Item>_> *)(ctx + 0x60));
  uVar2 = *(undefined4 *)(ctx + 0x7b);
  (this->inst).method = *(int *)(ctx + 0x78);
  *(undefined4 *)((long)&(this->inst).method + 3) = uVar2;
  std::vector<char,_std::allocator<char>_>::operator=
            (&(this->inst).ctypes,(vector<char,_std::allocator<char>_> *)(ctx + 0x80));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).nopts,(vector<int,_std::allocator<int>_> *)(ctx + 0x98));
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->inst).demands,(vector<int,_std::allocator<int>_> *)(ctx + 0xb0));
  iVar17 = (this->inst).ndims;
  this->LOSS = (this->inst).nsizes;
  this->label_size = iVar17;
  Instance::sorted_items(&local_168,this_01);
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Item,_std::allocator<Item>_>::~vector(local_138);
  std::vector<Item,_std::allocator<Item>_>::~vector(&local_168);
  pvVar25 = &this->maxW;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::resize
            (pvVar25,(long)this->label_size,(value_type *)local_138);
  iVar17 = (this->inst).ndims;
  if (0 < iVar17) {
    piVar4 = (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar5 = (this->inst).Ws.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (ulong)(uint)(this->inst).nbtypes;
    lVar18 = 0;
    do {
      if (0 < (int)uVar20) {
        iVar17 = piVar4[lVar18];
        lVar22 = 0;
        pvVar21 = pvVar5;
        do {
          iVar3 = *(int *)(*(long *)&(pvVar21->super__Vector_base<int,_std::allocator<int>_>).
                                     _M_impl.super__Vector_impl_data + lVar18 * 4);
          if (iVar17 <= iVar3) {
            iVar17 = iVar3;
          }
          piVar4[lVar18] = iVar17;
          lVar22 = lVar22 + 1;
          uVar20 = (ulong)(this->inst).nbtypes;
          pvVar21 = pvVar21 + 1;
        } while (lVar22 < (long)uVar20);
        iVar17 = this_01->ndims;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < iVar17);
  }
  std::vector<int,_std::allocator<int>_>::operator=(&this->max_label,pvVar25);
  if ((this->inst).binary != false) {
    this->label_size = (this->inst).ndims + 1;
    local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,0x7fffffff);
    iVar6._M_current =
         (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->max_label,iVar6,(int *)local_138);
    }
    else {
      *iVar6._M_current = 0x7fffffff;
      (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar6._M_current + 1;
    }
  }
  piVar1 = &(this->inst).nsizes;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_168,pvVar25);
  if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&local_168,
               (iterator)
               local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
               super__Vector_impl_data._M_finish,piVar1);
    uVar19 = *piVar1;
  }
  else {
    uVar19 = *piVar1;
    *(uint *)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar19;
    local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                super__Vector_impl_data._M_finish + 4);
  }
  if ((this->inst).binary == false) {
    local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl
                                .super__Vector_impl_data._M_start & 0xffffffff00000000);
    if ((int)uVar19 < 1) {
      iVar17 = 0;
    }
    else {
      lVar18 = 0;
      iVar17 = 0;
      do {
        iVar3 = *(int *)((long)&((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->demand + lVar18);
        if (iVar3 < iVar17) {
          iVar3 = iVar17;
        }
        iVar17 = iVar3;
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar17);
        lVar18 = lVar18 + 0x48;
      } while ((ulong)uVar19 * 0x48 != lVar18);
    }
    if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_168,
                 (iterator)
                 local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)local_138);
    }
    else {
      *(int *)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar17;
      local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                                  super__Vector_impl_data._M_finish + 4);
    }
    uVar19 = *piVar1;
  }
  local_148 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
               *)&this->weights;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_148,(long)(int)uVar19);
  local_150 = pvVar25;
  if (0 < *piVar1) {
    lVar18 = 0;
    lVar26 = 0;
    lVar22 = 0;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->weights).
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data + lVar18),
                 (vector<int,_std::allocator<int>_> *)
                 ((long)&(((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                           super__Vector_impl_data._M_start)->w).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar26));
      lVar22 = lVar22 + 1;
      lVar26 = lVar26 + 0x48;
      lVar18 = lVar18 + 0x18;
    } while (lVar22 < *piVar1);
  }
  local_13c = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_138,(long)this_01->ndims,&local_13c,
             &local_169);
  std::
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  ::emplace_back<std::vector<int,std::allocator<int>>>
            (local_148,(vector<int,_std::allocator<int>_> *)local_138);
  pvVar25 = local_150;
  if (local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  count_max_rep((vector<int,_std::allocator<int>_> *)local_138,this,pvVar25,0,0);
  piVar4 = (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                      super__Vector_impl_data._M_start;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                       super__Vector_impl_data._M_finish;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((piVar4 != (pointer)0x0) &&
     (operator_delete(piVar4),
     local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (0 < (int)((ulong)((long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
    lVar18 = 0;
    pIVar13 = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar16 = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      pIVar12 = local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                  _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
      uVar19 = *(uint *)((long)&(pIVar13->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar18 * 4);
      iVar17 = 0;
      if (uVar19 != 0) {
        iVar17 = 0;
        do {
          iVar17 = iVar17 + 1;
          bVar9 = 1 < uVar19;
          uVar19 = (int)uVar19 >> 1;
        } while (bVar9);
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = SUB84(pIVar12,4);
        local_138[0].super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)CONCAT44(local_138[0].super__Vector_base<Item,_std::allocator<Item>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,iVar17);
      }
      iVar6._M_current =
           (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->hash_bits,iVar6,(int *)local_138);
        pIVar13 = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pIVar16 = local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        *iVar6._M_current = iVar17;
        (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (int)((ulong)((long)pIVar16 - (long)pIVar13) >> 2));
  }
  piVar1 = &(this->inst).method;
  printf("Build (method = %d)\n",(ulong)(uint)*piVar1);
  if (*piVar1 != -3) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "inst.method >= MIN_METHOD && inst.method <= MAX_METHOD",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x4d);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,(char *)local_138);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  build(this);
  this_00 = &this->NS;
  iVar17 = NodeSet::size(this_00);
  uVar19 = iVar17 + (this->inst).nbtypes;
  pAVar7 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar8 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar17 = NodeSet::size(this_00);
  uVar24 = (int)((ulong)((long)pAVar8 - (long)pAVar7) >> 2) * -0x55555555 +
           (iVar17 + -1) * (this->inst).nbtypes + 1;
  cVar14 = clock();
  printf("  Step-3\' Graph: %d vertices and %d arcs (%.2fs)\n",
         SUB84((double)(cVar14 - this->tstart) / 1000000.0,0),(ulong)uVar19,(ulong)uVar24);
  final_compression_step(this);
  finalize(this);
  iVar17 = NodeSet::size(this_00);
  uVar27 = iVar17 + (int)((ulong)((long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->Ts).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
  uVar23 = (int)((ulong)((long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  cVar14 = clock();
  printf("  Step-4\' Graph: %d vertices and %d arcs (%.2fs)\n",
         SUB84((double)(cVar14 - this->tstart) / 1000000.0,0),(ulong)uVar27,(ulong)uVar23);
  printf("  #V4/#V3 = %.2f\n",SUB84((double)(int)uVar27 / (double)(int)uVar19,0));
  printf("  #A4/#A3 = %.2f\n",SUB84((double)(int)uVar23 / (double)(int)uVar24,0));
  cVar14 = clock();
  iVar17 = printf("Ready! (%.2fs)\n",SUB84((double)(cVar14 - this->tstart) / 1000000.0,0));
  if (this->ready == false) {
    snprintf((char *)local_138,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == true",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x5e);
    prVar15 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar15,(char *)local_138);
    __cxa_throw(prVar15,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<Item,_std::allocator<Item>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar17 = extraout_EAX;
  }
  return iVar17;
}

Assistant:

void Arcflow::init(const Instance &_inst) {
	throw_assert(ready == false);
	inst = _inst;
	LOSS = inst.nsizes;
	label_size = inst.ndims;
	sitems = inst.sorted_items();
	maxW.resize(label_size, 0);
	for (int d = 0; d < inst.ndims; d++) {
		for (int t = 0; t < inst.nbtypes; t++) {
			maxW[d] = std::max(maxW[d], inst.Ws[t][d]);
		}
	}

	max_label = maxW;
	if (inst.binary) {
		label_size = inst.ndims + 1;
		max_label.push_back(INT_MAX);
	}

	std::vector<int> max_state = maxW;
	max_state.push_back(inst.nsizes);
	if (!inst.binary) {
		int maxb = 0;
		for (int it = 0; it < inst.nsizes; it++) {
			maxb = std::max(maxb, sitems[it].demand);
		}
		max_state.push_back(maxb);
	}

	weights.resize(inst.nsizes);
	for (int i = 0; i < inst.nsizes; i++) {
		weights[i] = sitems[i].w;
	}
	weights.push_back(std::vector<int>(inst.ndims, 0));  // loss arcs

	max_rep = count_max_rep(maxW, 0, 0);

	for (int i = 0; i < static_cast<int>(max_state.size()); i++) {
		int nbits = 0, value = max_state[i];
		while (value) {
			nbits++;
			value >>= 1;
		}
		hash_bits.push_back(nbits);
	}

	printf("Build (method = %d)\n", inst.method);
	throw_assert(inst.method >= MIN_METHOD && inst.method <= MAX_METHOD);

	build();  // build step-3' graph
	int nv1 = NS.size() + inst.nbtypes;
	int na1 = A.size() + (NS.size() - 1) * inst.nbtypes + 1;
	printf("  Step-3' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv1, na1, TIMEDIF(tstart));

	final_compression_step();  // create step-4' graph
	finalize();  // add the final loss arcs
	int nv2 = NS.size() + Ts.size();
	int na2 = A.size();
	printf("  Step-4' Graph: %d vertices and %d arcs (%.2fs)\n",
		   nv2, na2, TIMEDIF(tstart));
	printf("  #V4/#V3 = %.2f\n", nv2 / static_cast<double>(nv1));
	printf("  #A4/#A3 = %.2f\n", na2 / static_cast<double>(na1));
	printf("Ready! (%.2fs)\n", TIMEDIF(tstart));
	throw_assert(ready == true);
}